

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbedTexturesProcess.cpp
# Opt level: O2

void __thiscall
Assimp::EmbedTexturesProcess::SetupProperties(EmbedTexturesProcess *this,Importer *pImp)

{
  string *this_00;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_59);
  Importer::GetPropertyString(&local_58,pImp,"sourceFilePath",&local_38);
  this_00 = &this->mRootPath;
  std::__cxx11::string::_M_assign((string *)this_00);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::find_last_of((char *)this_00,0x63a0ab);
  std::__cxx11::string::substr((ulong)&local_58,(ulong)this_00);
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void EmbedTexturesProcess::SetupProperties(const Importer* pImp) {
    mRootPath = pImp->GetPropertyString("sourceFilePath");
    mRootPath = mRootPath.substr(0, mRootPath.find_last_of("\\/") + 1u);
}